

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::Parser::ParseChunk
          (Parser *this,StringPiece chunk,string *out_error)

{
  pointer pcVar1;
  size_t size;
  bool bVar2;
  int iVar3;
  StringPiece line;
  StringPiece local_88;
  StringPiece local_78;
  StringPiece local_68;
  string local_50;
  
  local_78.length_ = chunk.length_;
  local_78.ptr_ = chunk.ptr_;
  local_88.ptr_ = (char *)0x0;
  local_88.length_ = 0;
  pcVar1 = local_78.ptr_;
  size = local_78.length_;
  if ((this->leftover_)._M_string_length != 0) {
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,&local_78);
    std::__cxx11::string::_M_append((char *)&this->leftover_,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pcVar1 = (this->leftover_)._M_dataplus._M_p;
    size = (this->leftover_)._M_string_length;
    if ((long)size < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
    }
  }
  local_88.length_ = size;
  local_88.ptr_ = pcVar1;
  local_68.ptr_ = (char *)0x0;
  local_68.length_ = 0;
  bVar2 = ReadLine(&local_88,&local_68);
  if (bVar2) {
    do {
      this->line_ = this->line_ + 1;
      RemoveComment(&local_68);
      TrimWhitespace(&local_68);
      if ((local_68.length_ != 0) &&
         (iVar3 = (*this->line_consumer_->_vptr_LineConsumer[2])
                            (this->line_consumer_,&local_68,out_error), (char)iVar3 == '\0')) {
        if (out_error->_M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)out_error,0,(char *)0x0,0x3f21c5);
        }
        goto LAB_00274eba;
      }
      bVar2 = ReadLine(&local_88,&local_68);
    } while (bVar2);
  }
  if (local_88.length_ == 0) {
LAB_00274eba:
    (this->leftover_)._M_string_length = 0;
    *(this->leftover_)._M_dataplus._M_p = '\0';
  }
  else {
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,&local_88);
    std::__cxx11::string::operator=((string *)&this->leftover_,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (bool)(~bVar2 & 1);
}

Assistant:

bool Parser::ParseChunk(StringPiece chunk, std::string* out_error) {
  StringPiece full_chunk;
  if (!leftover_.empty()) {
    leftover_ += std::string(chunk);
    full_chunk = StringPiece(leftover_);
  } else {
    full_chunk = chunk;
  }

  StringPiece line;
  while (ReadLine(&full_chunk, &line)) {
    ++line_;
    RemoveComment(&line);
    TrimWhitespace(&line);
    if (!line.empty() && !line_consumer_->ConsumeLine(line, out_error)) {
      if (out_error->empty()) {
        *out_error = "ConsumeLine failed without setting an error.";
      }
      leftover_.clear();
      return false;
    }
  }

  if (full_chunk.empty()) {
    leftover_.clear();
  } else {
    leftover_ = std::string(full_chunk);
  }
  return true;
}